

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptStreamOutTemplateType
          (HlslGrammar *this,TType *type,TLayoutGeometry *geometry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  TIntermNode *nodeList;
  TIntermNode *local_20;
  
  *geometry = ElgNone;
  bVar1 = acceptOutputPrimitiveGeometry(this,geometry);
  if ((bVar1) &&
     (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle), bVar1)
     ) {
    local_20 = (TIntermNode *)0x0;
    bVar1 = acceptType(this,type,&local_20);
    if (bVar1) {
      iVar2 = (*type->_vptr_TType[10])(type);
      *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) =
           *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) & 0xffffffffffffff80 | 0x11;
      iVar2 = (*type->_vptr_TType[10])(type);
      *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) =
           *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0xffffffffffff007f | 0x4980;
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
      if (bVar1) {
        return true;
      }
      pcVar3 = "right angle bracket";
    }
    else {
      pcVar3 = "stream output type";
    }
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,"Expected",pcVar3,"");
    return false;
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptStreamOutTemplateType(TType& type, TLayoutGeometry& geometry)
{
    geometry = ElgNone;

    if (! acceptOutputPrimitiveGeometry(geometry))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle))
        return false;

    if (! acceptType(type)) {
        expected("stream output type");
        return false;
    }

    type.getQualifier().storage = EvqOut;
    type.getQualifier().builtIn = EbvGsOutputStream;

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    return true;
}